

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

size_t Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(uint objectCount)

{
  bool bVar1;
  undefined8 local_18;
  size_t allocPlusSize;
  uint objectCount_local;
  
  local_18 = Math::Align<unsigned_long>((ulong)objectCount,8);
  bVar1 = Recycler::DoProfileAllocTracker();
  if (bVar1) {
    local_18 = (ulong)objectCount * 8 + local_18;
  }
  return local_18;
}

Assistant:

size_t
SmallHeapBlockT<TBlockAttributes>::GetAllocPlusSize(uint objectCount)
{
    // Small Heap Block Layout:
    //      TrackerData * [objectCount]  (Optional)
    //      ObjectInfo    [objectCount]  (In reverse index order)
    //      <Small*HeapBlock>

    size_t allocPlusSize = Math::Align<size_t>(sizeof(unsigned char) * objectCount, sizeof(size_t));
#ifdef PROFILE_RECYCLER_ALLOC
    if (Recycler::DoProfileAllocTracker())
    {
        allocPlusSize += objectCount * sizeof(void *);
    }
#endif
    return allocPlusSize;
}